

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O3

tbx_t * tbx_index(BGZF *fp,int min_shift,tbx_conf_t *conf)

{
  char cVar1;
  short sVar2;
  int n_lvls;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  khint_t kVar9;
  tbx_t *tbx;
  hts_idx_t *phVar10;
  char *pcVar11;
  kh_s2i_t *pkVar12;
  bool bVar13;
  uint64_t offset0;
  long lVar14;
  tbx_intv_t intv;
  int local_a0;
  int local_9c;
  hts_idx_t *local_90;
  int local_7c;
  kstring_t local_78;
  tbx_intv_t local_58;
  
  tbx = (tbx_t *)calloc(1,0x28);
  local_78.l = 0;
  local_78.m = 0;
  local_78.s = (char *)0x0;
  iVar3 = conf->line_skip;
  (tbx->conf).meta_char = conf->meta_char;
  (tbx->conf).line_skip = iVar3;
  iVar3 = conf->sc;
  iVar4 = conf->bc;
  iVar5 = conf->ec;
  (tbx->conf).preset = conf->preset;
  (tbx->conf).sc = iVar3;
  (tbx->conf).bc = iVar4;
  (tbx->conf).ec = iVar5;
  if (min_shift < 1) {
    local_a0 = 2;
    n_lvls = 5;
    local_9c = 0xe;
  }
  else {
    n_lvls = (0x21 - min_shift) / 3;
    local_a0 = 0;
    local_9c = min_shift;
  }
  bVar13 = true;
  local_90 = (hts_idx_t *)0x0;
  pkVar12 = (kh_s2i_t *)0x0;
  lVar14 = 0;
  offset0 = 0;
  while (iVar7 = bgzf_getline(fp,10,&local_78), -1 < iVar7) {
    iVar7 = (tbx->conf).line_skip;
    while ((lVar14 < iVar7 || ((tbx->conf).meta_char == (int)*local_78.s))) {
      offset0 = (ulong)(ushort)fp->block_offset | fp->block_address << 0x10;
      iVar8 = bgzf_getline(fp,10,&local_78);
      lVar14 = lVar14 + 1;
      if (iVar8 < 0) goto LAB_001175b1;
    }
    if (bVar13) {
      phVar10 = hts_idx_init(0,local_a0,offset0,local_9c,n_lvls);
      tbx->idx = phVar10;
    }
    iVar7 = tbx_parse1((tbx_conf_t *)tbx,(int)local_78.l,local_78.s,&local_58);
    pcVar6 = local_58.se;
    pcVar11 = local_58.ss;
    if (iVar7 == 0) {
      cVar1 = *local_58.se;
      *local_58.se = '\0';
      if (pkVar12 == (kh_s2i_t *)0x0) {
        pkVar12 = kh_init_s2i();
        tbx->dict = pkVar12;
      }
      kVar9 = kh_put_s2i(pkVar12,pcVar11,&local_7c);
      if (local_7c != 0) {
        pcVar11 = strdup(pcVar11);
        pkVar12->keys[kVar9] = pcVar11;
        pkVar12->vals[kVar9] = (ulong)(pkVar12->size - 1);
      }
      if (kVar9 == pkVar12->n_buckets) {
        local_58.tid = -1;
        *pcVar6 = cVar1;
      }
      else {
        local_58.tid = (int)pkVar12->vals[kVar9];
        *pcVar6 = cVar1;
      }
    }
    else {
      sVar2 = (short)(tbx->conf).preset;
      pcVar11 = "TBX_GENERIC";
      if (sVar2 == 2) {
        pcVar11 = "TBX_VCF";
      }
      if (sVar2 == 1) {
        pcVar11 = "TBX_SAM";
      }
      fprintf(_stderr,
              "[E::%s] failed to parse %s, was wrong -p [type] used?\nThe offending line was: \"%s\"\n"
              ,"get_intv",pcVar11,local_78.s);
    }
    lVar14 = lVar14 + 1;
    local_90 = tbx->idx;
    iVar7 = hts_idx_push(local_90,local_58.tid,(int)local_58.beg,(int)local_58.end,
                         (ulong)(ushort)fp->block_offset | fp->block_address << 0x10,1);
    bVar13 = false;
    if (iVar7 < 0) {
      free(local_78.s);
      tbx_destroy(tbx);
      return (tbx_t *)0x0;
    }
  }
LAB_001175b1:
  if (local_90 == (hts_idx_t *)0x0) {
    local_90 = hts_idx_init(0,local_a0,offset0,local_9c,n_lvls);
    tbx->idx = local_90;
  }
  if (tbx->dict == (void *)0x0) {
    pkVar12 = kh_init_s2i();
    tbx->dict = pkVar12;
  }
  hts_idx_finish(local_90,(ulong)(ushort)fp->block_offset | fp->block_address << 0x10);
  tbx_set_meta(tbx);
  free(local_78.s);
  return tbx;
}

Assistant:

tbx_t *tbx_index(BGZF *fp, int min_shift, const tbx_conf_t *conf)
{
    tbx_t *tbx;
    kstring_t str;
    int ret, first = 0, n_lvls, fmt;
    int64_t lineno = 0;
    uint64_t last_off = 0;
    tbx_intv_t intv;

    str.s = 0; str.l = str.m = 0;
    tbx = (tbx_t*)calloc(1, sizeof(tbx_t));
    tbx->conf = *conf;
    if (min_shift > 0) n_lvls = (TBX_MAX_SHIFT - min_shift + 2) / 3, fmt = HTS_FMT_CSI;
    else min_shift = 14, n_lvls = 5, fmt = HTS_FMT_TBI;
    while ((ret = bgzf_getline(fp, '\n', &str)) >= 0) {
        ++lineno;
        if (lineno <= tbx->conf.line_skip || str.s[0] == tbx->conf.meta_char) {
            last_off = bgzf_tell(fp);
            continue;
        }
        if (first == 0) {
            tbx->idx = hts_idx_init(0, fmt, last_off, min_shift, n_lvls);
            first = 1;
        }
        get_intv(tbx, &str, &intv, 1);
        ret = hts_idx_push(tbx->idx, intv.tid, intv.beg, intv.end, bgzf_tell(fp), 1);
        if (ret < 0)
        {
            free(str.s);
            tbx_destroy(tbx);
            return NULL;
        }
    }
    if ( !tbx->idx ) tbx->idx = hts_idx_init(0, fmt, last_off, min_shift, n_lvls);   // empty file
    if ( !tbx->dict ) tbx->dict = kh_init(s2i);
    hts_idx_finish(tbx->idx, bgzf_tell(fp));
    tbx_set_meta(tbx);
    free(str.s);
    return tbx;
}